

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O1

void __thiscall QExpandingLineEdit::resizeToContents(QExpandingLineEdit *this)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  LayoutDirection LVar5;
  QPoint QVar6;
  QSize QVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  undefined1 local_58 [24];
  QFontMetrics local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar9 = (*(int *)(*(long *)(this + 0x20) + 0x1c) - *(int *)(*(long *)(this + 0x20) + 0x14)) + 1;
  if (*(int *)(this + 0x28) == -1) {
    *(int *)(this + 0x28) = iVar9;
  }
  lVar2 = *(long *)(*(long *)(this + 8) + 0x10);
  if (lVar2 != 0) {
    QVar6 = QWidget::pos((QWidget *)this);
    QVar7 = QWidget::minimumSize((QWidget *)this);
    QFontMetrics::QFontMetrics(local_40,(QFont *)(*(long *)(this + 0x20) + 0x38));
    QLineEdit::displayText((QString *)local_58,(QLineEdit *)this);
    iVar4 = QFontMetrics::horizontalAdvance((QString *)local_40,(int)(QString *)local_58);
    iVar4 = iVar4 + QVar7.wd.m_i.m_i;
    piVar3 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),2,0x10);
      }
    }
    QFontMetrics::~QFontMetrics(local_40);
    lVar2 = *(long *)(lVar2 + 0x20);
    iVar8 = *(int *)(lVar2 + 0x1c);
    iVar1 = *(int *)(lVar2 + 0x14);
    LVar5 = QWidget::layoutDirection((QWidget *)this);
    iVar9 = iVar9 + QVar6.xp.m_i.m_i;
    iVar8 = (iVar8 + 1) - (iVar1 + QVar6.xp.m_i.m_i);
    if (LVar5 == RightToLeft) {
      iVar8 = iVar9;
    }
    iVar1 = *(int *)(this + 0x28);
    if (iVar8 <= *(int *)(this + 0x28)) {
      iVar1 = iVar8;
    }
    if (iVar4 <= iVar8) {
      iVar8 = iVar4;
    }
    if (iVar8 < iVar1) {
      iVar8 = iVar1;
    }
    if (this[0x2c] == (QExpandingLineEdit)0x1) {
      QWidget::setMaximumWidth((QWidget *)this,iVar8);
    }
    LVar5 = QWidget::layoutDirection((QWidget *)this);
    if (LVar5 == RightToLeft) {
      local_58._0_4_ = iVar9 - iVar8;
      local_58._4_4_ = QVar6.yp.m_i;
      QWidget::move((QWidget *)this,(QPoint *)local_58);
    }
    local_58._4_4_ =
         (*(int *)(*(long *)(this + 0x20) + 0x20) - *(int *)(*(long *)(this + 0x20) + 0x18)) + 1;
    local_58._0_4_ = iVar8;
    QWidget::resize((QWidget *)this,(QSize *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QExpandingLineEdit::resizeToContents()
{
    int oldWidth = width();
    if (originalWidth == -1)
        originalWidth = oldWidth;
    if (QWidget *parent = parentWidget()) {
        QPoint position = pos();
        int hintWidth = minimumWidth() + fontMetrics().horizontalAdvance(displayText());
        int parentWidth = parent->width();
        int maxWidth = isRightToLeft() ? position.x() + oldWidth : parentWidth - position.x();
        int newWidth = qBound(qMin(originalWidth, maxWidth), hintWidth, maxWidth);
        if (widgetOwnsGeometry)
            setMaximumWidth(newWidth);
        if (isRightToLeft())
            move(position.x() - newWidth + oldWidth, position.y());
        resize(newWidth, height());
    }
}